

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h__02_Writer.cpp
# Opt level: O3

h__AS02WriterFrame * __thiscall
AS_02::h__AS02WriterFrame::WriteEKLVPacket
          (h__AS02WriterFrame *this,FrameBuffer *FrameBuf,byte_t *EssenceUL,
          ui32_t *MinEssenceElementBerLength,AESEncContext *Ctx,HMACContext *HMAC)

{
  uint uVar1;
  undefined8 uVar2;
  _List_node_base *p_Var3;
  ui32_t uVar4;
  undefined8 *puVar5;
  _List_node_base *p_Var6;
  Dictionary *pDVar7;
  int64_t tmp_pos;
  undefined **local_248;
  undefined1 local_240;
  undefined8 local_23f;
  undefined8 uStack_237;
  Result_t local_228 [104];
  UL local_1c0 [4];
  undefined4 local_140;
  _List_node_base *local_138;
  undefined8 local_108;
  undefined4 local_100;
  FrameBuffer local_f0;
  undefined8 local_ef;
  undefined8 uStack_e7;
  _Rb_tree<ASDCP::UL,_ASDCP::UL,_std::_Identity<ASDCP::UL>,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>
  local_d0 [56];
  
  uVar2 = *(undefined8 *)(FrameBuf + 0x340);
  pDVar7 = (Dictionary *)(FrameBuf + 0x10);
  ASDCP::Write_EKLV_Packet
            ((FileWriter *)this,pDVar7,*(OP1aHeader **)(FrameBuf + 8),
             (WriterInfo *)(FrameBuf + 0x50),FrameBuf + 0x378,(uint *)(FrameBuf + 0x348),
             (ulonglong *)(FrameBuf + 0x338),FrameBuf + 0x340,EssenceUL,MinEssenceElementBerLength,
             Ctx,HMAC);
  if (-1 < *(int *)&(this->super_h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR>).
                    super_TrackFileWriter<ASDCP::MXF::OP1aHeader>._vptr_TrackFileWriter) {
    local_1c0[0].super_Identifier<16U>.super_IArchive._vptr_IArchive =
         (_func_int **)ASDCP::MXF::Partition::WriteToFile;
    local_1c0[0].super_Identifier<16U>.m_HasValue = false;
    local_1c0[0].super_Identifier<16U>.m_Value[0] = '\0';
    local_1c0[0].super_Identifier<16U>.m_Value[1] = 0x80;
    local_1c0[0].super_Identifier<16U>.m_Value._7_8_ = uVar2;
    MXF::AS02IndexWriterVBR::PushIndexEntry
              ((AS02IndexWriterVBR *)(FrameBuf + 0x448),(IndexEntry *)local_1c0);
  }
  uVar1 = *(uint *)(FrameBuf + 0x338);
  if ((1 < uVar1) && ((uVar1 + 1) % *(uint *)(FrameBuf + 0x440) == 0)) {
    uVar4 = MXF::AS02IndexWriterVBR::GetDuration((AS02IndexWriterVBR *)(FrameBuf + 0x448));
    if (uVar4 == 0) {
      __assert_fail("m_IndexWriter.GetDuration() > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/h__02_Writer.cpp"
                    ,0xd6,
                    "Result_t AS_02::h__AS02WriterFrame::WriteEKLVPacket(const ASDCP::FrameBuffer &, const byte_t *, const ui32_t &, AESEncContext *, HMACContext *)"
                   );
    }
    h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR>::FlushIndexPartition
              ((h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR> *)&stack0xffffffffffffff68);
    Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff68);
    puVar5 = (undefined8 *)ASDCP::Dictionary::Type((MDD_t)*(undefined8 *)(FrameBuf + 8));
    local_240 = 1;
    local_23f = *puVar5;
    uStack_237 = puVar5[1];
    local_248 = &PTR__IArchive_0016acf0;
    ASDCP::MXF::Partition::Partition((Partition *)local_1c0,*(Dictionary **)(FrameBuf + 8));
    local_140 = *(undefined4 *)(FrameBuf + 0xd0);
    local_100 = 1;
    local_f0 = FrameBuf[0x120];
    local_ef = *(undefined8 *)(FrameBuf + 0x121);
    uStack_e7 = *(undefined8 *)(FrameBuf + 0x129);
    std::
    _Rb_tree<ASDCP::UL,_ASDCP::UL,_std::_Identity<ASDCP::UL>,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>
    ::operator=(local_d0,(_Rb_tree<ASDCP::UL,_ASDCP::UL,_std::_Identity<ASDCP::UL>,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>
                          *)(FrameBuf + 0x140));
    (**(code **)(*(long *)pDVar7 + 0x30))(local_228,pDVar7,&tmp_pos);
    Kumu::Result_t::~Result_t(local_228);
    local_138 = (_List_node_base *)tmp_pos;
    local_108 = *(undefined8 *)(FrameBuf + 0x340);
    ASDCP::MXF::Partition::WriteToFile((FileWriter *)local_228,local_1c0);
    Kumu::Result_t::operator=((Result_t *)this,local_228);
    Kumu::Result_t::~Result_t(local_228);
    p_Var3 = local_138;
    p_Var6 = (_List_node_base *)operator_new(0x28);
    p_Var6[1]._M_next = (_List_node_base *)&PTR__IArchive_0016ae30;
    *(undefined4 *)&p_Var6[1]._M_prev = 1;
    p_Var6[2]._M_next = p_Var3;
    std::__detail::_List_node_base::_M_hook(p_Var6);
    *(long *)(FrameBuf + 0x2f8) = *(long *)(FrameBuf + 0x2f8) + 1;
    ASDCP::MXF::Partition::~Partition((Partition *)local_1c0);
  }
  return this;
}

Assistant:

Result_t
AS_02::h__AS02WriterFrame::WriteEKLVPacket(const ASDCP::FrameBuffer& FrameBuf,const byte_t* EssenceUL,
					   const ui32_t& MinEssenceElementBerLength,
					   AESEncContext* Ctx, HMACContext* HMAC)
{
  ui64_t this_stream_offset = m_StreamOffset; // m_StreamOffset will be changed by the call to Write_EKLV_Packet

  Result_t result = Write_EKLV_Packet(m_File, *m_Dict, m_HeaderPart, m_Info, m_CtFrameBuf, m_FramesWritten,
				      m_StreamOffset, FrameBuf, EssenceUL, MinEssenceElementBerLength, Ctx, HMAC);

  if ( KM_SUCCESS(result) )
    {  
      IndexTableSegment::IndexEntry Entry;
      Entry.StreamOffset = this_stream_offset;
      m_IndexWriter.PushIndexEntry(Entry);
    }

  if ( m_FramesWritten > 1 && ( ( m_FramesWritten + 1 ) % m_PartitionSpace ) == 0 )
    {
      assert(m_IndexWriter.GetDuration() > 0);
      FlushIndexPartition();

      UL body_ul(m_Dict->ul(MDD_ClosedCompleteBodyPartition));
      Partition body_part(m_Dict);
      body_part.MajorVersion = m_HeaderPart.MajorVersion;
      body_part.MinorVersion = m_HeaderPart.MinorVersion;
      body_part.BodySID = 1;
      body_part.OperationalPattern = m_HeaderPart.OperationalPattern;
      body_part.EssenceContainers = m_HeaderPart.EssenceContainers;
      body_part.ThisPartition = m_File.TellPosition();

      body_part.BodyOffset = m_StreamOffset;
      result = body_part.WriteToFile(m_File, body_ul);
      m_RIP.PairArray.push_back(RIP::PartitionPair(1, body_part.ThisPartition));
    }

  return result;
}